

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_ptr.hpp
# Opt level: O0

void __thiscall
nonstd::vptr::
value_ptr<(anonymous_namespace)::NoDefaultCopyMove,_nonstd::vptr::detail::default_clone<(anonymous_namespace)::NoDefaultCopyMove>,_std::default_delete<(anonymous_namespace)::NoDefaultCopyMove>_>
::~value_ptr(value_ptr<(anonymous_namespace)::NoDefaultCopyMove,_nonstd::vptr::detail::default_clone<(anonymous_namespace)::NoDefaultCopyMove>,_std::default_delete<(anonymous_namespace)::NoDefaultCopyMove>_>
             *this)

{
  value_ptr<(anonymous_namespace)::NoDefaultCopyMove,_nonstd::vptr::detail::default_clone<(anonymous_namespace)::NoDefaultCopyMove>,_std::default_delete<(anonymous_namespace)::NoDefaultCopyMove>_>
  *this_local;
  
  detail::
  compressed_ptr<(anonymous_namespace)::NoDefaultCopyMove,_nonstd::vptr::detail::default_clone<(anonymous_namespace)::NoDefaultCopyMove>,_std::default_delete<(anonymous_namespace)::NoDefaultCopyMove>_>
  ::~compressed_ptr(&this->ptr);
  return;
}

Assistant:

~value_ptr() = default;